

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<char_const*>>,std::tuple<char_const*>>
               (tuple<testing::Matcher<const_char_*>_> *matchers,tuple<const_char_*> *values,
               ostream *os)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<Matcher<const_char_*>_>_> *p_Var2;
  __tuple_element_t<0UL,_tuple<const_char_*>_> *ppcVar3;
  ostream *poVar4;
  MatcherBase<const_char_*> *this;
  string local_208;
  undefined1 local_1d8 [8];
  StringMatchResultListener listener;
  Value value;
  type matcher;
  ostream *os_local;
  tuple<const_char_*> *values_local;
  tuple<testing::Matcher<const_char_*>_> *matchers_local;
  
  matcher.super_MatcherBase<const_char_*>.impl_.link_.next_ = (linked_ptr_internal *)os;
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<char_const*>>,std::tuple<char_const*>>
            (matchers,values,os);
  p_Var2 = std::get<0ul,testing::Matcher<char_const*>>(matchers);
  Matcher<const_char_*>::Matcher((Matcher<const_char_*> *)&value,p_Var2);
  ppcVar3 = std::get<0ul,char_const*>(values);
  listener._400_8_ = *ppcVar3;
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1d8);
  bVar1 = MatcherBase<const_char_*>::MatchAndExplain
                    ((MatcherBase<const_char_*> *)&value,(char *)listener._400_8_,
                     (MatchResultListener *)local_1d8);
  if (!bVar1) {
    poVar4 = std::operator<<((ostream *)matcher.super_MatcherBase<const_char_*>.impl_.link_.next_,
                             "  Expected arg #");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
    std::operator<<(poVar4,": ");
    this = &std::get<0ul,testing::Matcher<char_const*>>(matchers)->super_MatcherBase<const_char_*>;
    MatcherBase<const_char_*>::DescribeTo
              (this,(ostream *)matcher.super_MatcherBase<const_char_*>.impl_.link_.next_);
    std::operator<<((ostream *)matcher.super_MatcherBase<const_char_*>.impl_.link_.next_,
                    "\n           Actual: ");
    UniversalPrint<char_const*>
              ((char **)&listener.field_0x190,
               (ostream *)matcher.super_MatcherBase<const_char_*>.impl_.link_.next_);
    StringMatchResultListener::str_abi_cxx11_(&local_208,(StringMatchResultListener *)local_1d8);
    PrintIfNotEmpty(&local_208,(ostream *)matcher.super_MatcherBase<const_char_*>.impl_.link_.next_)
    ;
    std::__cxx11::string::~string((string *)&local_208);
    std::operator<<((ostream *)matcher.super_MatcherBase<const_char_*>.impl_.link_.next_,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1d8);
  Matcher<const_char_*>::~Matcher((Matcher<const_char_*> *)&value);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }